

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida.c
# Opt level: O2

int IDAGetSolution(void *ida_mem,sunrealtype t,N_Vector yret,N_Vector ypret)

{
  double dVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (ida_mem == (void *)0x0) {
    iVar2 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0xd26,"IDAGetSolution",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    dVar1 = *(double *)((long)ida_mem + 0x2a8);
    dVar7 = *(double *)((long)ida_mem + 0x290);
    dVar9 = (ABS(dVar7) + ABS(dVar1)) * *(double *)((long)ida_mem + 8) * 100.0;
    dVar8 = 0.0;
    if (0.0 <= (t - ((dVar1 - *(double *)((long)ida_mem + 0x298)) -
                    (double)(-(ulong)(dVar7 < 0.0) & (ulong)-dVar9 |
                            ~-(ulong)(dVar7 < 0.0) & (ulong)dVar9))) * dVar7) {
      uVar6 = *(int *)((long)ida_mem + 0x26c) + (uint)(*(int *)((long)ida_mem + 0x26c) == 0);
      dVar7 = *(double *)((long)ida_mem + 0x90);
      dVar9 = (t - dVar1) / dVar7;
      *(undefined8 *)((long)ida_mem + 0x4b0) = 0x3ff0000000000000;
      uVar4 = 0;
      uVar5 = 0;
      if (0 < (int)uVar6) {
        uVar5 = (ulong)uVar6;
      }
      dVar10 = 1.0;
      for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
        dVar8 = dVar8 * dVar9 + dVar10 / dVar7;
        dVar10 = dVar10 * dVar9;
        dVar9 = dVar7 + (t - dVar1);
        dVar7 = *(double *)((long)ida_mem + uVar4 * 8 + 0x98);
        dVar9 = dVar9 / dVar7;
        *(double *)((long)ida_mem + uVar4 * 8 + 0x4b8) = dVar10;
        *(double *)((long)ida_mem + 0x4e0 + uVar4 * 8) = dVar8;
      }
      iVar2 = N_VLinearCombination(uVar6 + 1,(long)ida_mem + 0x4b0,(long)ida_mem + 0x60,yret);
      if (iVar2 == 0) {
        iVar3 = N_VLinearCombination(uVar6,(long)ida_mem + 0x4e0,(long)ida_mem + 0x68,ypret);
        iVar2 = -0x1c;
        if (iVar3 == 0) {
          iVar2 = 0;
        }
      }
      else {
        iVar2 = -0x1c;
      }
    }
    else {
      iVar2 = -0x1a;
      IDAProcessError((IDAMem)ida_mem,-0x1a,0xd33,"IDAGetSolution",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida.c"
                      ,
                      "Illegal value for t.t = %.15g is not between tcur - hold = %.15g and tcur = %.15g"
                     );
    }
  }
  return iVar2;
}

Assistant:

int IDAGetSolution(void* ida_mem, sunrealtype t, N_Vector yret, N_Vector ypret)
{
  IDAMem IDA_mem;
  sunrealtype tfuzz, tp, delt, c, d, gam;
  int j, kord, retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Check t for legality.  Here tn - hused is t_{n-1}. */

  tfuzz = HUNDRED * IDA_mem->ida_uround *
          (SUNRabs(IDA_mem->ida_tn) + SUNRabs(IDA_mem->ida_hh));
  if (IDA_mem->ida_hh < ZERO) { tfuzz = -tfuzz; }
  tp = IDA_mem->ida_tn - IDA_mem->ida_hused - tfuzz;
  if ((t - tp) * IDA_mem->ida_hh < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_BAD_T, __LINE__, __func__, __FILE__, MSG_BAD_T,
                    t, IDA_mem->ida_tn - IDA_mem->ida_hused, IDA_mem->ida_tn);
    return (IDA_BAD_T);
  }

  /* Initialize kord = (kused or 1). */

  kord = IDA_mem->ida_kused;
  if (IDA_mem->ida_kused == 0) { kord = 1; }

  /* Accumulate multiples of columns phi[j] into yret and ypret. */

  delt = t - IDA_mem->ida_tn;
  c    = ONE;
  d    = ZERO;
  gam  = delt / IDA_mem->ida_psi[0];

  IDA_mem->ida_cvals[0] = c;
  for (j = 1; j <= kord; j++)
  {
    d   = d * gam + c / IDA_mem->ida_psi[j - 1];
    c   = c * gam;
    gam = (delt + IDA_mem->ida_psi[j - 1]) / IDA_mem->ida_psi[j];

    IDA_mem->ida_cvals[j]     = c;
    IDA_mem->ida_dvals[j - 1] = d;
  }

  retval = N_VLinearCombination(kord + 1, IDA_mem->ida_cvals, IDA_mem->ida_phi,
                                yret);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  retval = N_VLinearCombination(kord, IDA_mem->ida_dvals, IDA_mem->ida_phi + 1,
                                ypret);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (IDA_SUCCESS);
}